

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.h
# Opt level: O2

void __thiscall PathAlias::PathAlias(PathAlias *this,string *alias)

{
  string local_60;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  
  (this->diskPath)._M_pathname._M_dataplus._M_p = (pointer)&(this->diskPath)._M_pathname.field_2;
  (this->diskPath)._M_pathname._M_string_length = 0;
  (this->diskPath)._M_pathname.field_2._M_local_buf[0] = '\0';
  (this->diskPath)._M_cmpts.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->diskPath)._M_cmpts.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->diskPath)._M_cmpts.
           super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->diskPath)._M_cmpts.
           super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->aliasTo)._M_dataplus._M_p = (pointer)&(this->aliasTo).field_2;
  (this->aliasTo)._M_string_length = 0;
  (this->aliasTo).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"=",
             (allocator<char> *)
             ((long)&parts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  split<char>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40,alias,&local_60,0);
  std::__cxx11::string::~string((string *)&local_60);
  if ((ulong)((long)parts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)local_40) < 0x21) {
    std::experimental::filesystem::v1::__cxx11::path::operator=(&this->diskPath,alias);
  }
  else {
    std::experimental::filesystem::v1::__cxx11::path::operator=
              (&this->diskPath,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::__cxx11::string::_M_assign((string *)&this->aliasTo);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return;
}

Assistant:

PathAlias(const std::string& alias)
    {
        auto parts = split(alias, "=");
        if (parts.size() > 1) {
            diskPath = parts[0];
            aliasTo = parts[1];
        } else
            diskPath = alias;
    }